

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ootake_PSG.c
# Opt level: O2

void OPSG_ResetVolumeReg(void *chip)

{
  undefined4 *puVar1;
  long lVar2;
  
  *(undefined8 *)((long)chip + 0x624) = 0;
  puVar1 = (undefined4 *)((long)chip + 0x600);
  for (lVar2 = 0xe; lVar2 != 0x122; lVar2 = lVar2 + 0x2e) {
    *(undefined4 *)((long)chip + lVar2 * 4 + -0x10) = 0;
    *(undefined8 *)((long)chip + lVar2 * 4 + -4) = 0;
    puVar1[-8] = 0;
    *puVar1 = 0;
    puVar1 = puVar1 + 1;
  }
  return;
}

Assistant:

static void
OPSG_ResetVolumeReg(void* chip)
{
	huc6280_state* info = (huc6280_state*)chip;
	int	i;

	info->MainVolumeL = 0;
	info->MainVolumeR = 0;
	for (i = 0; i < N_CHANNEL; i++)
	{
		info->Psg[i].volume = 0;
		info->Psg[i].outVolumeL = 0;
		info->Psg[i].outVolumeR = 0;
		info->DdaFadeOutL[i] = 0;
		info->DdaFadeOutR[i] = 0;
	}
}